

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_sinc_resampler.cc
# Opt level: O0

size_t __thiscall
webrtc::PushSincResampler::Resample
          (PushSincResampler *this,int16_t *source,size_t source_length,int16_t *destination,
          size_t destination_capacity)

{
  undefined1 auVar1 [16];
  pointer pfVar2;
  ulong uVar3;
  float *__p;
  size_t destination_capacity_local;
  int16_t *destination_local;
  size_t source_length_local;
  int16_t *source_local;
  PushSincResampler *this_local;
  
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->float_buffer_);
  if (pfVar2 == (pointer)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->destination_frames_;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    __p = (float *)operator_new__(uVar3);
    std::unique_ptr<float[],std::default_delete<float[]>>::reset<float*,void>
              ((unique_ptr<float[],std::default_delete<float[]>> *)&this->float_buffer_,__p);
  }
  this->source_ptr_int_ = source;
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->float_buffer_);
  Resample(this,(float *)0x0,source_length,pfVar2,this->destination_frames_);
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->float_buffer_);
  FloatS16ToS16(pfVar2,this->destination_frames_,destination);
  this->source_ptr_int_ = (int16_t *)0x0;
  return this->destination_frames_;
}

Assistant:

size_t PushSincResampler::Resample(const int16_t* source,
                                   size_t source_length,
                                   int16_t* destination,
                                   size_t destination_capacity) {
  if (!float_buffer_.get())
    float_buffer_.reset(new float[destination_frames_]);

  source_ptr_int_ = source;
  // Pass nullptr as the float source to have Run() read from the int16 source.
  Resample(nullptr, source_length, float_buffer_.get(), destination_frames_);
  FloatS16ToS16(float_buffer_.get(), destination_frames_, destination);
  source_ptr_int_ = nullptr;
  return destination_frames_;
}